

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarextension.cpp
# Opt level: O1

void __thiscall QToolBarExtension::QToolBarExtension(QToolBarExtension *this,QWidget *parent)

{
  QAnyStringView QVar1;
  
  QToolButton::QToolButton((QToolButton *)this,parent);
  *(undefined ***)this = &PTR_metaObject_0080cac8;
  *(undefined ***)(this + 0x10) = &PTR__QToolBarExtension_0080cc98;
  *(undefined4 *)(this + 0x28) = 1;
  QVar1.m_size = (size_t)"qt_toolbar_ext_button";
  QVar1.field_0.m_data_utf8 = (char *)this;
  QObject::setObjectName(QVar1);
  QToolButton::setAutoRaise((QToolButton *)this,true);
  setOrientation(this,*(Orientation *)(this + 0x28));
  QWidget::setSizePolicy((QWidget *)this,(QSizePolicy)0x110000);
  QAbstractButton::setCheckable((QAbstractButton *)this,true);
  return;
}

Assistant:

QToolBarExtension::QToolBarExtension(QWidget *parent)
    : QToolButton(parent)
    , m_orientation(Qt::Horizontal)
{
    setObjectName("qt_toolbar_ext_button"_L1);
    setAutoRaise(true);
    setOrientation(m_orientation);
    setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Minimum);
    setCheckable(true);
}